

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_0::TestCase161::run::anon_class_8_1_a8c68091::operator()
          (anon_class_8_1_a8c68091 *this)

{
  __pid_t __pid;
  int iVar1;
  anon_class_8_1_a8c68091 *this_local;
  
  __pid = getpid();
  iVar1 = sigqueue(__pid,0x17,*(sigval *)this->value);
  return iVar1;
}

Assistant:

KJ_SYSCALL_HANDLE_ERRORS(sigqueue(getpid(), SIGURG, value)) {
    case ENOSYS:
      // sigqueue() not supported. Maybe running on WSL.
      KJ_LOG(WARNING, "sigqueue() is not implemented by your system; skipping test");
      return;
    default:
      KJ_FAIL_SYSCALL("sigqueue(getpid(), SIGURG, value)", error);
  }